

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ans_smsb.hpp
# Opt level: O2

ans_smsb_encode<10U> *
ans_smsb_encode<10U>::create(ans_smsb_encode<10U> *__return_storage_ptr__,uint32_t *in_u32,size_t n)

{
  pointer puVar1;
  uint32_t uVar2;
  pointer puVar3;
  int iVar4;
  uint64_t *puVar5;
  size_t i;
  size_t sVar6;
  uint32_t uVar7;
  long lVar8;
  allocator_type local_61;
  vector<unsigned_long,_std::allocator<unsigned_long>_> freqs;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->nfreqs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->table).
  super__Vector_base<enc_entry_smsb,_std::allocator<enc_entry_smsb>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->table).
  super__Vector_base<enc_entry_smsb,_std::allocator<enc_entry_smsb>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->table).
  super__Vector_base<enc_entry_smsb,_std::allocator<enc_entry_smsb>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->nfreqs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->nfreqs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->nfreqs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->table).
  super__Vector_base<enc_entry_smsb,_std::allocator<enc_entry_smsb>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&freqs,0x500,(value_type_conflict2 *)&local_48,&local_61);
  uVar7 = 0;
  for (sVar6 = 0; n != sVar6; sVar6 = sVar6 + 1) {
    uVar2 = ans_smsb_mapping(in_u32[sVar6]);
    freqs.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start[uVar2] =
         freqs.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_start[uVar2] + 1;
    if (uVar7 < uVar2) {
      uVar7 = uVar2;
    }
  }
  adjust_freqs((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48,&freqs,uVar7,true,10
              );
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign
            (&__return_storage_ptr__->nfreqs,&local_48);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_48);
  iVar4 = 0;
  for (puVar3 = (__return_storage_ptr__->nfreqs).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start;
      puVar3 != (__return_storage_ptr__->nfreqs).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish; puVar3 = puVar3 + 1) {
    iVar4 = iVar4 + *puVar3;
  }
  __return_storage_ptr__->frame_size = (long)iVar4;
  std::vector<enc_entry_smsb,_std::allocator<enc_entry_smsb>_>::resize
            (&__return_storage_ptr__->table,(ulong)(uVar7 + 1));
  puVar3 = (__return_storage_ptr__->nfreqs).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar1 = (__return_storage_ptr__->nfreqs).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  uVar7 = 0;
  puVar5 = &((__return_storage_ptr__->table).
             super__Vector_base<enc_entry_smsb,_std::allocator<enc_entry_smsb>_>._M_impl.
             super__Vector_impl_data._M_start)->sym_upper_bound;
  for (lVar8 = 0; (long)puVar1 - (long)puVar3 >> 2 != lVar8; lVar8 = lVar8 + 1) {
    ((enc_entry_smsb *)(puVar5 + -1))->freq = puVar3[lVar8];
    *(uint32_t *)((long)puVar5 + -4) = uVar7;
    uVar7 = uVar7 + puVar3[lVar8];
    *puVar5 = (ulong)puVar3[lVar8] << 0x24;
    puVar5 = puVar5 + 2;
  }
  __return_storage_ptr__->lower_bound = __return_storage_ptr__->frame_size << 4;
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&freqs.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  return __return_storage_ptr__;
}

Assistant:

static ans_smsb_encode create(const uint32_t* in_u32, size_t n)
    {
        ans_smsb_encode model;
        std::vector<uint64_t> freqs(smsb_constants::MAX_SIGMA, 0);
        uint32_t max_sym = 0;
        for (size_t i = 0; i < n; i++) {
            auto mapped_u32 = ans_smsb_mapping(in_u32[i]);
            freqs[mapped_u32]++;
            max_sym = std::max(mapped_u32, max_sym);
        }
        model.nfreqs = adjust_freqs(freqs, max_sym, true, H_approx);
        model.frame_size = std::accumulate(
            std::begin(model.nfreqs), std::end(model.nfreqs), 0);
        uint64_t cur_base = 0;
        uint64_t tmp = constants::K * constants::RADIX;
        model.table.resize(max_sym + 1);
        for (size_t sym = 0; sym < model.nfreqs.size(); sym++) {
            model.table[sym].freq = model.nfreqs[sym];
            model.table[sym].base = cur_base;
            model.table[sym].sym_upper_bound = tmp * model.nfreqs[sym];
            cur_base += model.nfreqs[sym];
        }
        model.lower_bound = constants::K * model.frame_size;
        return model;
    }